

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QPoint>::data(QList<QPoint> *this)

{
  QArrayDataPointer<QPoint> *this_00;
  QPoint *pQVar1;
  QArrayDataPointer<QPoint> *in_RDI;
  
  detach((QList<QPoint> *)0x12ea7c);
  this_00 = (QArrayDataPointer<QPoint> *)QArrayDataPointer<QPoint>::operator->(in_RDI);
  pQVar1 = QArrayDataPointer<QPoint>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }